

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svwaitdown.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  char **ppcVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  ssize_t sVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  char *x1;
  long lVar15;
  unsigned_long sec;
  tai now;
  tai start;
  char status [20];
  strerr *psVar16;
  int local_70;
  unsigned_long local_68;
  ulong local_60;
  tai local_58;
  tai local_50;
  char local_48 [12];
  int local_3c;
  char local_37;
  
  local_68 = 600;
  progname = *argv;
  iVar7 = sgetoptmine(argc,argv,"t:xkvV");
  if (iVar7 == subgetoptdone) {
    local_70 = 0;
    bVar5 = true;
    bVar4 = true;
  }
  else {
    bVar4 = false;
    local_70 = 0;
    bVar5 = false;
    do {
      if (iVar7 < 0x74) {
        if (iVar7 != 0x3f) {
          if (iVar7 != 0x56) {
            if (iVar7 == 0x6b) {
              bVar5 = true;
            }
            goto LAB_001023ba;
          }
          strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                      (strerr *)0x0);
        }
LAB_00102384:
        strerr_die(1,"usage: ",progname," [-v] [-t 1..6000] service ...","\n",(char *)0x0,
                   (char *)0x0,(strerr *)0x0);
      }
      else if (iVar7 == 0x78) {
        local_70 = 1;
      }
      else if (iVar7 == 0x76) {
        bVar4 = true;
      }
      else if ((iVar7 == 0x74) &&
              (scan_ulong(subgetoptarg,&local_68), local_68 - 0x1771 < 0xffffffffffffe890))
      goto LAB_00102384;
LAB_001023ba:
      iVar7 = sgetoptmine(argc,argv,"t:xkvV");
    } while (iVar7 != subgetoptdone);
    bVar4 = !bVar4;
    bVar5 = !bVar5;
  }
  lVar15 = (long)subgetoptind;
  if (argv[lVar15] == (char *)0x0) {
    strerr_die(1,"usage: ",progname," [-v] [-t 1..6000] service ...","\n",(char *)0x0,(char *)0x0,
               (strerr *)0x0);
  }
  ppcVar3 = argv + lVar15;
  iVar7 = open_read(".");
  if (iVar7 == -1) {
    strerr_die(0x6f,"svwaitdown: fatal: ","unable to open current working directory",": ",
               (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
  }
  if (*ppcVar3 != (char *)0x0) {
    dir = ppcVar3;
    do {
      if ((dir != ppcVar3) && (iVar8 = fchdir(iVar7), iVar8 == -1)) {
        strerr_die(0x6f,"svwaitdown: fatal: ","unable to switch to starting directory",": ",
                   (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      }
      iVar8 = chdir(*dir);
      if ((iVar8 != -1) && (iVar8 = open_write("supervise/control"), iVar8 != -1)) {
        write(iVar8,"dx",(ulong)(local_70 + 1));
        close(iVar8);
      }
      ppcVar1 = dir + 1;
      dir = dir + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  dir = ppcVar3;
  tai_now(&local_50);
  if (*dir != (char *)0x0) {
    local_60 = (ulong)(local_70 + 1);
    do {
      iVar8 = fchdir(iVar7);
      if (iVar8 == -1) {
        strerr_die(0x6f,"svwaitdown: fatal: ","unable to switch to starting directory",": ",
                   (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      }
      iVar8 = chdir(*dir);
      if (iVar8 == -1) {
LAB_00102944:
        pcVar14 = *dir;
        dir = dir + 1;
        rc = rc + 1;
        psVar16 = &strerr_sys;
        pcVar13 = ": unable to change directory: ";
LAB_0010296d:
        strerr_warn("svwaitdown: warning: ",pcVar14,pcVar13,(char *)0x0,(char *)0x0,(char *)0x0,
                    psVar16);
      }
      else {
        iVar8 = open_write("supervise/ok");
        if (iVar8 == -1) {
          piVar12 = __errno_location();
          if (*piVar12 == error_nodevice) {
LAB_001026f8:
            if (!bVar4) {
              pcVar14 = *dir;
              pcVar13 = ": runsv not running.";
LAB_0010278a:
              strerr_warn("svwaitdown: ",pcVar14,pcVar13,(char *)0x0,(char *)0x0,(char *)0x0,
                          (strerr *)0x0);
            }
LAB_00102797:
            dir = dir + 1;
            goto LAB_0010297a;
          }
          pcVar14 = *dir;
          dir = dir + 1;
          rc = rc + 1;
          psVar16 = &strerr_sys;
          pcVar13 = ": unable to open supervise/ok: ";
          goto LAB_0010296d;
        }
        close(iVar8);
        iVar8 = open_read("supervise/status");
        if (iVar8 == -1) {
          pcVar14 = *dir;
          dir = dir + 1;
          rc = rc + 1;
          psVar16 = &strerr_sys;
          pcVar13 = "unable to open supervise/status: ";
          goto LAB_0010296d;
        }
        iVar9 = buffer_unixread(iVar8,local_48,0x14);
        close(iVar8);
        if (iVar9 < 0x12 || iVar9 == 0x13) {
          pcVar14 = *dir;
          rc = rc + 1;
          dir = dir + 1;
          if (iVar9 == -1) {
            psVar16 = &strerr_sys;
            pcVar13 = "unable to read supervise/status: ";
          }
          else {
            psVar16 = (strerr *)0x0;
            pcVar13 = ": unable to read supervise/status: bad format.";
          }
          goto LAB_0010296d;
        }
        if ((local_70 == 0) && (local_3c == 0)) {
          if (!bVar4) {
            pcVar14 = *dir;
            pcVar13 = ": down.";
            goto LAB_0010278a;
          }
          goto LAB_00102797;
        }
        if (local_37 == 'd') {
LAB_00102818:
          tai_now(&local_58);
          tai_sub(&local_58,&local_58,&local_50);
          if (((double)CONCAT44(0x45300000,(int)(local_68 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0) <=
              ((double)CONCAT44(0x45300000,(int)(local_58.x >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_58.x) - 4503599627370496.0)) {
            if (!bVar4) {
              strerr_warn("svwaitdown: ","timeout.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                          (strerr *)0x0);
            }
            if (bVar5) {
LAB_00102a7f:
              _exit(0x6f);
            }
            iVar8 = chdir(*dir);
            if (iVar8 == -1) goto LAB_00102944;
            iVar8 = open_write("supervise/control");
            if (iVar8 == -1) {
              piVar12 = __errno_location();
              if (*piVar12 == error_nodevice) goto LAB_001026f8;
              pcVar14 = *ppcVar3;
              goto LAB_001029a5;
            }
            sVar11 = write(iVar8,"k",1);
            if (sVar11 == 1) {
              pcVar14 = *dir;
              psVar16 = (strerr *)0x0;
              x1 = "svwaitdown: ";
              pcVar13 = ": killed.";
            }
            else {
              pcVar14 = *ppcVar3;
              dir = dir + 1;
              rc = rc + 1;
              psVar16 = &strerr_sys;
              x1 = "svwaitdown: warning: ";
              pcVar13 = ": unable to write to supervise/control: ";
            }
            strerr_warn(x1,pcVar14,pcVar13,(char *)0x0,(char *)0x0,(char *)0x0,psVar16);
            close(iVar8);
            ppcVar1 = dir + 1;
            ppcVar2 = dir + 1;
            dir = ppcVar1;
            if (*ppcVar2 == (char *)0x0) goto LAB_00102a7f;
          }
          else {
            sleep(1);
          }
        }
        else {
          iVar8 = open_write("supervise/control");
          uVar6 = local_60;
          if (iVar8 == -1) {
            pcVar14 = *dir;
LAB_001029a5:
            dir = dir + 1;
            rc = rc + 1;
            psVar16 = &strerr_sys;
            pcVar13 = ": unable to open supervise/control: ";
            goto LAB_0010296d;
          }
          sVar10 = write(iVar8,"dx",local_60);
          if (sVar10 == uVar6) {
            close(iVar8);
            goto LAB_00102818;
          }
          pcVar14 = *dir;
          dir = dir + 1;
          rc = rc + 1;
          strerr_warn("svwaitdown: warning: ",pcVar14,": unable to write to supervise/control: ",
                      (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
          close(iVar8);
        }
      }
LAB_0010297a:
    } while (*dir != (char *)0x0);
  }
  iVar8 = fchdir(iVar7);
  if (iVar8 == -1) {
    strerr_warn("svwaitdown: warning: ","unable to switch to starting directory: ",(char *)0x0,
                (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
  }
  close(iVar7);
  if (100 < rc) {
    rc = 100;
  }
  _exit(rc);
}

Assistant:

int main(int argc, const char * const *argv) {
  int opt;
  unsigned long sec =600;
  int verbose =0;
  int doexit =0;
  int dokill =0;
  int wdir;
  int fd;
  char status[20];
  int r;
  unsigned long pid;
  struct tai start;
  struct tai now;

  progname =*argv;

  while ((opt =getopt(argc, argv, "t:xkvV")) != opteof) {
    switch(opt) {
    case 't':
      scan_ulong(optarg, &sec);
      if ((sec < 1) || (sec > 6000)) usage();
      break;
    case 'x':
      doexit =1;
      break;
    case 'k':
      dokill =1;
      break;
    case 'v':
      verbose =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");

  for (dir =argv; *dir; ++dir) {
    if (dir != argv)
      if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) continue; /* bummer */
    if ((fd =open_write("supervise/control")) == -1) continue; /* bummer */
    if (write(fd, "dx", 1 +doexit) != (1 +doexit)) {
      close(fd); continue; /* bummer */
    }
    close(fd);
  }
  dir =argv;

  tai_now(&start);
  while (*dir) {
    if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) {
      warn(*dir, ": unable to change directory: ", &strerr_sys);
      continue;
    }
    if ((fd =open_write("supervise/ok")) == -1) {
      if (errno == error_nodevice) {
        if (verbose) strerr_warn3(INFO, *dir, ": runsv not running.", 0);
        dir++;
      }
      else
        warn(*dir, ": unable to open supervise/ok: ", &strerr_sys);
      continue;
    }
    close(fd);

    if ((fd =open_read("supervise/status")) == -1) {
      warn(*dir, "unable to open supervise/status: ", &strerr_sys);
      continue;
    }
    r =buffer_unixread(fd, status, 20);
    close(fd);
    if ((r < 18) || (r == 19)) { /* supervise compatibility */
      if (r == -1)
        warn(*dir, "unable to read supervise/status: ", &strerr_sys);
      else
        warn(*dir, ": unable to read supervise/status: bad format.", 0);
      continue;
    }
    pid =(unsigned char)status[15];
    pid <<=8; pid +=(unsigned char)status[14];
    pid <<=8; pid +=(unsigned char)status[13];
    pid <<=8; pid +=(unsigned char)status[12];

    if (! doexit && ! pid) {
      /* ok, service is down */
      if (verbose) strerr_warn3(INFO, *dir, ": down.", 0);
      dir++;
      continue;
    }

    if (status[17] != 'd') { /* catch previous failures */
      if ((fd =open_write("supervise/control")) == -1) {
        warn(*dir, ": unable to open supervise/control: ", &strerr_sys);
        continue;
      }
      if (write(fd, "dx", 1 +doexit) != (1 +doexit)) {
        warn(*dir, ": unable to write to supervise/control: ", &strerr_sys);
        close(fd);
        continue;
      }
      close(fd);
    }

    tai_now(&now);
    tai_sub(&now, &now, &start);
    if (tai_approx(&now) >= sec) {
      /* timeout */
      if (verbose) strerr_warn2(INFO, "timeout.", 0);
      if (dokill) {
        if (chdir(*dir) == -1) {
          warn(*dir, ": unable to change directory: ", &strerr_sys);
          continue;
        }
        if ((fd =open_write("supervise/control")) == -1) {
          if (errno == error_nodevice) {
            if (verbose)
              strerr_warn3(INFO, *dir, ": runsv not running.", 0);
            dir++;
          }
          else
            warn(*argv, ": unable to open supervise/control: ", &strerr_sys);
          continue;
        }
        if (write(fd, "k", 1) != 1)
          warn(*argv, ": unable to write to supervise/control: ", &strerr_sys);
        else
          strerr_warn3(INFO, *dir, ": killed.", 0);
        close(fd);
        dir++;
        if (! *dir) _exit(111);
        continue;
      }
      _exit(111);
    }
    sleep(1);
  }
  if (fchdir(wdir) == -1)
    strerr_warn2(WARN, "unable to switch to starting directory: ", &strerr_sys);
  close(wdir);
  if (rc > 100) rc =100;
  _exit(rc);
}